

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::ProcessHorizontal(Clipper *this,TEdge *horzEdge)

{
  MaximaList *pMVar1;
  double dVar2;
  _List_node_base *p_Var3;
  long lVar4;
  bool bVar5;
  TEdge *pTVar6;
  _List_node_base *p_Var7;
  long lVar8;
  _func_int *p_Var9;
  long *plVar10;
  TEdge *pTVar11;
  OutPt *pOVar12;
  OutPt *op2;
  _List_node_base *p_Var13;
  TEdge *pTVar14;
  long lVar15;
  _List_node_base *p_Var16;
  TEdge *pTVar17;
  long lVar18;
  long lVar19;
  _Self __tmp;
  _List_node_base *p_Var20;
  int iVar21;
  IntPoint OffPt;
  IntPoint OffPt_00;
  IntPoint Pt;
  TEdge *local_90;
  IntPoint local_78;
  OutPt *local_68;
  TEdge *local_60;
  int local_54;
  long local_50;
  long local_48;
  IntPoint *local_40;
  long local_38;
  
  lVar8 = (horzEdge->Bot).X;
  lVar15 = (horzEdge->Top).X;
  local_50 = lVar15;
  if (lVar8 < lVar15) {
    local_50 = lVar8;
  }
  iVar21 = horzEdge->WindDelta;
  local_48 = lVar15;
  if (lVar15 < lVar8) {
    local_48 = lVar8;
  }
  bVar5 = lVar8 < lVar15;
  local_90 = (TEdge *)0x0;
  pTVar11 = horzEdge;
  while (pTVar6 = pTVar11, pTVar11 = pTVar6->NextInLML, local_60 = horzEdge, pTVar11 != (TEdge *)0x0
        ) {
    if ((pTVar11->Dx != -1e+40) || (NAN(pTVar11->Dx))) goto LAB_002930c8;
  }
  local_90 = GetMaximaPair(pTVar6);
LAB_002930c8:
  pMVar1 = &this->m_Maxima;
  if ((this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
      _M_size == 0) {
    p_Var16 = (_List_node_base *)0x0;
  }
  else {
    if (lVar8 < lVar15) {
      p_Var16 = (_List_node_base *)0x0;
      p_Var20 = (_List_node_base *)pMVar1;
      do {
        p_Var20 = (((_List_base<long_long,_std::allocator<long_long>_> *)&p_Var20->_M_next)->_M_impl
                  )._M_node.super__List_node_base._M_next;
        if (p_Var20 == (_List_node_base *)pMVar1) goto LAB_00293140;
      } while ((long)p_Var20[1]._M_next <= lVar8);
      if ((pTVar6->Top).X <= (long)p_Var20[1]._M_next) {
        p_Var20 = (_List_node_base *)pMVar1;
      }
      p_Var16 = (_List_node_base *)0x0;
      goto LAB_00293140;
    }
    p_Var7 = (pMVar1->super__List_base<long_long,_std::allocator<long_long>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    p_Var20 = (_List_node_base *)0x0;
    p_Var13 = (_List_node_base *)pMVar1;
    do {
      p_Var16 = p_Var13;
      if (p_Var16 == p_Var7) goto LAB_00293140;
      p_Var3 = p_Var16->_M_prev[1]._M_next;
      p_Var13 = p_Var16->_M_prev;
    } while (lVar8 < (long)p_Var3);
    if ((long)p_Var3 <= (pTVar6->Top).X) {
      p_Var16 = p_Var7;
    }
  }
  p_Var20 = (_List_node_base *)0x0;
LAB_00293140:
  local_68 = (OutPt *)0x0;
  local_54 = iVar21;
  do {
    if ((&horzEdge->NextInAEL)[(byte)~bVar5] != (TEdge *)0x0) {
      local_38 = (ulong)(byte)~bVar5 * 8 + 0x68;
      local_40 = &horzEdge->Top;
      pTVar11 = (&horzEdge->NextInAEL)[(byte)~bVar5];
      do {
        if ((this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node
            ._M_size == 0) {
LAB_00293250:
          if (bVar5 != false) goto LAB_00293257;
LAB_00293267:
          lVar8 = (pTVar11->Curr).X;
          if (lVar8 < local_50) break;
        }
        else {
          if (bVar5 == false) {
            p_Var7 = (pMVar1->super__List_base<long_long,_std::allocator<long_long>_>)._M_impl.
                     _M_node.super__List_node_base._M_next;
            if (p_Var16 != p_Var7) {
              do {
                p_Var13 = p_Var16->_M_prev;
                if ((long)p_Var13[1]._M_next <= (pTVar11->Curr).X) break;
                if (-1 < horzEdge->OutIdx && iVar21 != 0) {
                  local_78.Y = (horzEdge->Bot).Y;
                  local_78.X = (cInt)p_Var13[1]._M_next;
                  AddOutPt(this,horzEdge,&local_78);
                  p_Var13 = p_Var16->_M_prev;
                  p_Var7 = (this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>.
                           _M_impl._M_node.super__List_node_base._M_next;
                }
                p_Var16 = p_Var13;
              } while (p_Var13 != p_Var7);
              goto LAB_00293250;
            }
            goto LAB_00293267;
          }
          if (p_Var20 != (_List_node_base *)pMVar1) {
            do {
              if ((pTVar11->Curr).X <= (long)p_Var20[1]._M_next) break;
              if (-1 < horzEdge->OutIdx && iVar21 != 0) {
                local_78.Y = (horzEdge->Bot).Y;
                local_78.X = (cInt)p_Var20[1]._M_next;
                AddOutPt(this,horzEdge,&local_78);
              }
              p_Var20 = p_Var20->_M_next;
            } while (p_Var20 != (_List_node_base *)pMVar1);
            goto LAB_00293250;
          }
LAB_00293257:
          lVar8 = (pTVar11->Curr).X;
          if (local_48 < lVar8) break;
        }
        if (((lVar8 == local_40->X) && (horzEdge->NextInLML != (TEdge *)0x0)) &&
           (dVar2 = horzEdge->NextInLML->Dx, pTVar11->Dx <= dVar2 && dVar2 != pTVar11->Dx)) break;
        if (-1 < horzEdge->OutIdx && iVar21 != 0) {
          local_68 = AddOutPt(this,horzEdge,&pTVar11->Curr);
          for (pTVar14 = this->m_SortedEdges; pTVar14 != (TEdge *)0x0; pTVar14 = pTVar14->NextInSEL)
          {
            if (-1 < (long)pTVar14->OutIdx) {
              lVar8 = (horzEdge->Bot).X;
              lVar15 = (horzEdge->Top).X;
              lVar18 = (pTVar14->Bot).X;
              lVar4 = (pTVar14->Top).X;
              lVar19 = lVar15;
              if (lVar8 < lVar15) {
                lVar19 = lVar8;
              }
              if (lVar15 < lVar8) {
                lVar15 = lVar8;
              }
              lVar8 = lVar4;
              if (lVar18 < lVar4) {
                lVar8 = lVar18;
              }
              if (lVar18 <= lVar4) {
                lVar18 = lVar4;
              }
              if ((lVar19 < lVar18) && (lVar8 < lVar15)) {
                plVar10 = (long *)(*(long *)(*(long *)((long)&this->m_ClipType +
                                                      (long)this->_vptr_Clipper[-3]) +
                                            (long)pTVar14->OutIdx * 8) + 0x18);
                if (pTVar14->Side != esLeft) {
                  plVar10 = (long *)(*plVar10 + 0x20);
                }
                OffPt.Y = (pTVar14->Top).Y;
                OffPt.X = lVar4;
                AddJoin(this,(OutPt *)*plVar10,local_68,OffPt);
              }
            }
          }
          AddGhostJoin(this,local_68,horzEdge->Bot);
        }
        if ((horzEdge == pTVar6) && (pTVar11 == local_90)) {
          if (-1 < horzEdge->OutIdx) {
            AddLocalMaxPoly(this,horzEdge,local_90,local_40);
          }
          p_Var9 = this->_vptr_Clipper[-3];
          pTVar11 = horzEdge->NextInAEL;
          pTVar14 = horzEdge->PrevInAEL;
          if (((pTVar14 != (TEdge *)0x0) || (pTVar11 != (TEdge *)0x0)) ||
             (pTVar17 = *(TEdge **)
                         (p_Var9 + 0x10 +
                         (long)&(this->m_Maxima).
                                super__List_base<long_long,_std::allocator<long_long>_>),
             pTVar17 == pTVar6)) {
            pTVar6 = pTVar14;
            if (pTVar14 == (TEdge *)0x0) {
              pTVar6 = (TEdge *)((long)&this->_vptr_Clipper + (long)p_Var9);
            }
            pTVar6->NextInAEL = pTVar11;
            if (pTVar11 != (TEdge *)0x0) {
              pTVar11->PrevInAEL = pTVar14;
            }
            horzEdge->NextInAEL = (TEdge *)0x0;
            horzEdge->PrevInAEL = (TEdge *)0x0;
            p_Var9 = this->_vptr_Clipper[-3];
            pTVar17 = *(TEdge **)
                       (p_Var9 + 0x10 +
                       (long)&(this->m_Maxima).
                              super__List_base<long_long,_std::allocator<long_long>_>);
          }
          pTVar11 = local_90->NextInAEL;
          pTVar6 = local_90->PrevInAEL;
          if (((pTVar6 == (TEdge *)0x0) && (pTVar11 == (TEdge *)0x0)) && (pTVar17 != local_90)) {
            return;
          }
          pTVar14 = (TEdge *)((long)&this->_vptr_Clipper + (long)p_Var9);
          if (pTVar6 != (TEdge *)0x0) {
            pTVar14 = pTVar6;
          }
          pTVar14->NextInAEL = pTVar11;
          if (pTVar11 != (TEdge *)0x0) {
            pTVar11->PrevInAEL = pTVar6;
          }
          local_90->NextInAEL = (TEdge *)0x0;
          local_90->PrevInAEL = (TEdge *)0x0;
          return;
        }
        if (bVar5 == false) {
          local_78.X = (pTVar11->Curr).X;
          local_78.Y = (horzEdge->Curr).Y;
          pTVar14 = horzEdge;
          pTVar17 = pTVar11;
        }
        else {
          local_78.X = (pTVar11->Curr).X;
          local_78.Y = (horzEdge->Curr).Y;
          pTVar14 = pTVar11;
          pTVar17 = horzEdge;
        }
        IntersectEdges(this,pTVar17,pTVar14,&local_78);
        pTVar14 = *(TEdge **)((long)&(pTVar11->Bot).X + local_38);
        ClipperBase::SwapPositionsInAEL
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   horzEdge,pTVar11);
        pTVar11 = pTVar14;
        iVar21 = local_54;
      } while (pTVar14 != (TEdge *)0x0);
    }
    pTVar11 = horzEdge->NextInLML;
    if (((pTVar11 == (TEdge *)0x0) || (pTVar11->Dx != -1e+40)) || (NAN(pTVar11->Dx))) {
      if ((-1 < (long)horzEdge->OutIdx) && (local_68 == (OutPt *)0x0)) {
        plVar10 = (long *)(*(long *)(*(long *)((long)&this->m_ClipType +
                                              (long)this->_vptr_Clipper[-3]) +
                                    (long)horzEdge->OutIdx * 8) + 0x18);
        if (horzEdge->Side != esLeft) {
          plVar10 = (long *)(*plVar10 + 0x20);
        }
        pOVar12 = (OutPt *)*plVar10;
        for (pTVar11 = this->m_SortedEdges; pTVar11 != (TEdge *)0x0; pTVar11 = pTVar11->NextInSEL) {
          if (-1 < (long)pTVar11->OutIdx) {
            lVar8 = (horzEdge->Bot).X;
            lVar15 = (horzEdge->Top).X;
            lVar18 = (pTVar11->Bot).X;
            lVar4 = (pTVar11->Top).X;
            lVar19 = lVar15;
            if (lVar8 < lVar15) {
              lVar19 = lVar8;
            }
            if (lVar15 < lVar8) {
              lVar15 = lVar8;
            }
            lVar8 = lVar4;
            if (lVar18 < lVar4) {
              lVar8 = lVar18;
            }
            if (lVar18 <= lVar4) {
              lVar18 = lVar4;
            }
            if ((lVar19 < lVar18) && (lVar8 < lVar15)) {
              plVar10 = (long *)(*(long *)(*(long *)((long)&this->m_ClipType +
                                                    (long)this->_vptr_Clipper[-3]) +
                                          (long)pTVar11->OutIdx * 8) + 0x18);
              if (pTVar11->Side != esLeft) {
                plVar10 = (long *)(*plVar10 + 0x20);
              }
              OffPt_00.Y = (pTVar11->Top).Y;
              OffPt_00.X = lVar4;
              AddJoin(this,(OutPt *)*plVar10,pOVar12,OffPt_00);
            }
          }
        }
        AddGhostJoin(this,pOVar12,horzEdge->Top);
        pTVar11 = horzEdge->NextInLML;
      }
      if (pTVar11 == (TEdge *)0x0) {
        if (-1 < horzEdge->OutIdx) {
          AddOutPt(this,horzEdge,&horzEdge->Top);
        }
        pTVar11 = horzEdge->NextInAEL;
        pTVar6 = horzEdge->PrevInAEL;
        if (((pTVar6 != (TEdge *)0x0) || (pTVar11 != (TEdge *)0x0)) ||
           (*(TEdge **)
             (this->_vptr_Clipper[-3] + 0x10 +
             (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>) ==
            horzEdge)) {
          pTVar14 = pTVar6;
          if (pTVar6 == (TEdge *)0x0) {
            pTVar14 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
          }
          pTVar14->NextInAEL = pTVar11;
          if (pTVar11 != (TEdge *)0x0) {
            pTVar11->PrevInAEL = pTVar6;
          }
          horzEdge->NextInAEL = (TEdge *)0x0;
          horzEdge->PrevInAEL = (TEdge *)0x0;
        }
      }
      else if (horzEdge->OutIdx < 0) {
        ClipperBase::UpdateEdgeIntoAEL
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   &local_60);
      }
      else {
        pOVar12 = AddOutPt(this,horzEdge,&horzEdge->Top);
        ClipperBase::UpdateEdgeIntoAEL
                  ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                   &local_60);
        pTVar11 = local_60;
        if (local_60->WindDelta != 0) {
          pTVar6 = local_60->NextInAEL;
          pTVar14 = local_60->PrevInAEL;
          if ((((((pTVar14 != (TEdge *)0x0) && ((pTVar14->Curr).X == (local_60->Bot).X)) &&
                ((lVar8 = (pTVar14->Curr).Y, lVar8 == (local_60->Bot).Y &&
                 ((pTVar14->WindDelta != 0 && (-1 < pTVar14->OutIdx)))))) &&
               ((pTVar14->Top).Y < lVar8)) &&
              (bVar5 = SlopesEqual(local_60,pTVar14,
                                   (bool)(this->_vptr_Clipper[-3] + 8)
                                         [(long)&(this->m_GhostJoins).
                                                 super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                         ]), bVar5)) ||
             (((((pTVar6 != (TEdge *)0x0 && ((pTVar6->Curr).X == (pTVar11->Bot).X)) &&
                (lVar8 = (pTVar6->Curr).Y, lVar8 == (pTVar11->Bot).Y)) &&
               ((pTVar6->WindDelta != 0 && (-1 < pTVar6->OutIdx)))) &&
              (((pTVar6->Top).Y < lVar8 &&
               (bVar5 = SlopesEqual(pTVar11,pTVar6,
                                    (bool)(this->_vptr_Clipper[-3] + 8)
                                          [(long)&(this->m_GhostJoins).
                                                  super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                          ]), pTVar14 = pTVar6, bVar5)))))) {
            op2 = AddOutPt(this,pTVar14,&pTVar11->Bot);
            AddJoin(this,pOVar12,op2,pTVar11->Top);
            return;
          }
        }
      }
      return;
    }
    ClipperBase::UpdateEdgeIntoAEL
              ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),&local_60
              );
    horzEdge = local_60;
    if (-1 < local_60->OutIdx) {
      AddOutPt(this,local_60,&local_60->Bot);
    }
    lVar8 = (horzEdge->Bot).X;
    local_48 = (horzEdge->Top).X;
    bVar5 = lVar8 < local_48;
    local_50 = local_48;
    if (lVar8 < local_48) {
      local_50 = lVar8;
    }
    if (local_48 < lVar8) {
      local_48 = lVar8;
    }
  } while( true );
}

Assistant:

void Clipper::ProcessHorizontal(TEdge *horzEdge)
{
  Direction dir;
  cInt horzLeft, horzRight;
  bool IsOpen = (horzEdge->WindDelta == 0);

  GetHorzDirection(*horzEdge, dir, horzLeft, horzRight);

  TEdge* eLastHorz = horzEdge, *eMaxPair = 0;
  while (eLastHorz->NextInLML && IsHorizontal(*eLastHorz->NextInLML)) 
    eLastHorz = eLastHorz->NextInLML;
  if (!eLastHorz->NextInLML)
    eMaxPair = GetMaximaPair(eLastHorz);

  MaximaList::const_iterator maxIt;
  MaximaList::const_reverse_iterator maxRit;
  if (m_Maxima.size() > 0)
  {
      //get the first maxima in range (X) ...
      if (dir == dLeftToRight)
      {
          maxIt = m_Maxima.begin();
          while (maxIt != m_Maxima.end() && *maxIt <= horzEdge->Bot.X) maxIt++;
          if (maxIt != m_Maxima.end() && *maxIt >= eLastHorz->Top.X)
              maxIt = m_Maxima.end();
      }
      else
      {
          maxRit = m_Maxima.rbegin();
          while (maxRit != m_Maxima.rend() && *maxRit > horzEdge->Bot.X) maxRit++;
          if (maxRit != m_Maxima.rend() && *maxRit <= eLastHorz->Top.X)
              maxRit = m_Maxima.rend();
      }
  }

  OutPt* op1 = 0;

  for (;;) //loop through consec. horizontal edges
  {
		  
    bool IsLastHorz = (horzEdge == eLastHorz);
    TEdge* e = GetNextInAEL(horzEdge, dir);
    while(e)
    {

        //this code block inserts extra coords into horizontal edges (in output
        //polygons) whereever maxima touch these horizontal edges. This helps
        //'simplifying' polygons (ie if the Simplify property is set).
        if (m_Maxima.size() > 0)
        {
            if (dir == dLeftToRight)
            {
                while (maxIt != m_Maxima.end() && *maxIt < e->Curr.X) 
                {
                  if (horzEdge->OutIdx >= 0 && !IsOpen)
                    AddOutPt(horzEdge, IntPoint(*maxIt, horzEdge->Bot.Y));
                  maxIt++;
                }
            }
            else
            {
                while (maxRit != m_Maxima.rend() && *maxRit > e->Curr.X)
                {
                  if (horzEdge->OutIdx >= 0 && !IsOpen)
                    AddOutPt(horzEdge, IntPoint(*maxRit, horzEdge->Bot.Y));
                  maxRit++;
                }
            }
        };

        if ((dir == dLeftToRight && e->Curr.X > horzRight) ||
			(dir == dRightToLeft && e->Curr.X < horzLeft)) break;

		//Also break if we've got to the end of an intermediate horizontal edge ...
		//nb: Smaller Dx's are to the right of larger Dx's ABOVE the horizontal.
		if (e->Curr.X == horzEdge->Top.X && horzEdge->NextInLML && 
			e->Dx < horzEdge->NextInLML->Dx) break;

    if (horzEdge->OutIdx >= 0 && !IsOpen)  //note: may be done multiple times
		{
#ifdef use_xyz
			if (dir == dLeftToRight) SetZ(e->Curr, *horzEdge, *e);
			else SetZ(e->Curr, *e, *horzEdge);
#endif      
			op1 = AddOutPt(horzEdge, e->Curr);
			TEdge* eNextHorz = m_SortedEdges;
			while (eNextHorz)
			{
				if (eNextHorz->OutIdx >= 0 &&
					HorzSegmentsOverlap(horzEdge->Bot.X,
					horzEdge->Top.X, eNextHorz->Bot.X, eNextHorz->Top.X))
				{
                    OutPt* op2 = GetLastOutPt(eNextHorz);
                    AddJoin(op2, op1, eNextHorz->Top);
				}
				eNextHorz = eNextHorz->NextInSEL;
			}
			AddGhostJoin(op1, horzEdge->Bot);
		}
		
		//OK, so far we're still in range of the horizontal Edge  but make sure
        //we're at the last of consec. horizontals when matching with eMaxPair
        if(e == eMaxPair && IsLastHorz)
        {
          if (horzEdge->OutIdx >= 0)
            AddLocalMaxPoly(horzEdge, eMaxPair, horzEdge->Top);
          DeleteFromAEL(horzEdge);
          DeleteFromAEL(eMaxPair);
          return;
        }
        
		if(dir == dLeftToRight)
        {
          IntPoint Pt = IntPoint(e->Curr.X, horzEdge->Curr.Y);
          IntersectEdges(horzEdge, e, Pt);
        }
        else
        {
          IntPoint Pt = IntPoint(e->Curr.X, horzEdge->Curr.Y);
          IntersectEdges( e, horzEdge, Pt);
        }
        TEdge* eNext = GetNextInAEL(e, dir);
        SwapPositionsInAEL( horzEdge, e );
        e = eNext;
    } //end while(e)

	//Break out of loop if HorzEdge.NextInLML is not also horizontal ...
	if (!horzEdge->NextInLML || !IsHorizontal(*horzEdge->NextInLML)) break;

	UpdateEdgeIntoAEL(horzEdge);
    if (horzEdge->OutIdx >= 0) AddOutPt(horzEdge, horzEdge->Bot);
    GetHorzDirection(*horzEdge, dir, horzLeft, horzRight);

  } //end for (;;)

  if (horzEdge->OutIdx >= 0 && !op1)
  {
      op1 = GetLastOutPt(horzEdge);
      TEdge* eNextHorz = m_SortedEdges;
      while (eNextHorz)
      {
          if (eNextHorz->OutIdx >= 0 &&
              HorzSegmentsOverlap(horzEdge->Bot.X,
              horzEdge->Top.X, eNextHorz->Bot.X, eNextHorz->Top.X))
          {
              OutPt* op2 = GetLastOutPt(eNextHorz);
              AddJoin(op2, op1, eNextHorz->Top);
          }
          eNextHorz = eNextHorz->NextInSEL;
      }
      AddGhostJoin(op1, horzEdge->Top);
  }

  if (horzEdge->NextInLML)
  {
    if(horzEdge->OutIdx >= 0)
    {
      op1 = AddOutPt( horzEdge, horzEdge->Top);
      UpdateEdgeIntoAEL(horzEdge);
      if (horzEdge->WindDelta == 0) return;
      //nb: HorzEdge is no longer horizontal here
      TEdge* ePrev = horzEdge->PrevInAEL;
      TEdge* eNext = horzEdge->NextInAEL;
      if (ePrev && ePrev->Curr.X == horzEdge->Bot.X &&
        ePrev->Curr.Y == horzEdge->Bot.Y && ePrev->WindDelta != 0 &&
        (ePrev->OutIdx >= 0 && ePrev->Curr.Y > ePrev->Top.Y &&
        SlopesEqual(*horzEdge, *ePrev, m_UseFullRange)))
      {
        OutPt* op2 = AddOutPt(ePrev, horzEdge->Bot);
        AddJoin(op1, op2, horzEdge->Top);
      }
      else if (eNext && eNext->Curr.X == horzEdge->Bot.X &&
        eNext->Curr.Y == horzEdge->Bot.Y && eNext->WindDelta != 0 &&
        eNext->OutIdx >= 0 && eNext->Curr.Y > eNext->Top.Y &&
        SlopesEqual(*horzEdge, *eNext, m_UseFullRange))
      {
        OutPt* op2 = AddOutPt(eNext, horzEdge->Bot);
        AddJoin(op1, op2, horzEdge->Top);
      }
    }
    else
      UpdateEdgeIntoAEL(horzEdge); 
  }
  else
  {
    if (horzEdge->OutIdx >= 0) AddOutPt(horzEdge, horzEdge->Top);
    DeleteFromAEL(horzEdge);
  }
}